

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::add(CmdLine *this,Arg *a)

{
  ArgListIterator AVar1;
  bool bVar2;
  SpecificationException *this_00;
  ulong uVar3;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  _Self local_28;
  _Self local_20;
  ArgListIterator it;
  Arg *a_local;
  CmdLine *this_local;
  
  it._M_node = (_List_node_base *)a;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
    bVar2 = std::operator!=(&local_20,&local_28);
    AVar1 = it;
    if (!bVar2) {
      (*(code *)(it._M_node)->_M_next[1]._M_next)(it._M_node,&this->_argList);
      uVar3 = (*(code *)(it._M_node)->_M_next[2]._M_prev)();
      if ((uVar3 & 1) != 0) {
        this->_numRequired = this->_numRequired + 1;
      }
      return;
    }
    std::_List_iterator<TCLAP::Arg_*>::operator*(&local_20);
    uVar3 = (*(code *)(AVar1._M_node)->_M_next[2]._M_next)();
    if ((uVar3 & 1) != 0) break;
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_20,0);
  }
  this_00 = (SpecificationException *)__cxa_allocate_exception(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Argument with same flag/name already exists!",&local_49);
  AVar1 = it;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"val",&local_a1);
  (*(code *)(AVar1._M_node)->_M_next[4]._M_prev)(local_80,AVar1._M_node,local_a0);
  SpecificationException::SpecificationException(this_00,(string *)local_48,local_80);
  __cxa_throw(this_00,&SpecificationException::typeinfo,
              SpecificationException::~SpecificationException);
}

Assistant:

inline void CmdLine::add( Arg* a )
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		if ( *a == *(*it) )
			throw( SpecificationException(
			        "Argument with same flag/name already exists!",
			        a->longID() ) );

	a->addToList( _argList );

	if ( a->isRequired() )
		_numRequired++;
}